

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

void Vta_ManProfileAddition(Vta_Man_t *p,Vec_Int_t *vTermsToAdd)

{
  int *piVar1;
  int i;
  void *pvVar2;
  Vta_Obj_t *pVVar3;
  Gia_Obj_t *pGVar4;
  int i_00;
  Gia_Man_t *p_00;
  long lVar5;
  
  p_00 = (Gia_Man_t *)((long)p->pPars->iFrame + 1);
  pvVar2 = calloc((size_t)p_00,4);
  for (i_00 = 0; i_00 < vTermsToAdd->nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(vTermsToAdd,i_00);
    p_00 = (Gia_Man_t *)p;
    pVVar3 = Vta_ManObj(p,i);
    if (pVVar3 == (Vta_Obj_t *)0x0) break;
    p_00 = p->pGia;
    pGVar4 = Gia_ManObj(p_00,pVVar3->iObj);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    piVar1 = (int *)((long)pvVar2 + (long)pVVar3->iFrame * 4);
    *piVar1 = *piVar1 + 1;
  }
  for (lVar5 = 0; lVar5 <= p->pPars->iFrame; lVar5 = lVar5 + 1) {
    Abc_Print((int)p_00,"%2d",(ulong)*(uint *)((long)pvVar2 + lVar5 * 4));
  }
  Abc_Print((int)p_00,"***\n");
  return;
}

Assistant:

void Vta_ManProfileAddition( Vta_Man_t * p, Vec_Int_t * vTermsToAdd )
{
    Vta_Obj_t * pThis;
    Gia_Obj_t * pObj;
    // profile the added ones
    int i, * pCounters = ABC_CALLOC( int, p->pPars->iFrame+1 );
    Vta_ManForEachObjObjVec( vTermsToAdd, p, pThis, pObj, i )
        pCounters[pThis->iFrame]++;
    for ( i = 0; i <= p->pPars->iFrame; i++ )
        Abc_Print( 1, "%2d", pCounters[i] );
    Abc_Print( 1, "***\n" );
}